

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall
CRenderTools::RenderCursor(CRenderTools *this,float CenterX,float CenterY,float Size)

{
  long in_FS_OFFSET;
  CQuadItem QuadItem;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
            (this->m_pGraphics,(ulong)(uint)g_pData->m_aImages[4].m_Id.m_Id);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0xb])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  local_20 = CenterX;
  local_1c = CenterY;
  local_18 = Size;
  local_14 = Size;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_20,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::RenderCursor(float CenterX, float CenterY, float Size)
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CURSOR].m_Id);
	Graphics()->WrapClamp();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	IGraphics::CQuadItem QuadItem(CenterX, CenterY, Size, Size);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}